

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

void absl::anon_unknown_0::AppendNumberUnit(string *out,int64_t n,DisplayUnit unit)

{
  char *__s;
  char local_27 [15];
  
  __s = Format64(local_27,0,n);
  if (*__s != '0' || __s + 1 != local_27) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out,__s,(long)local_27 - (long)__s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out,unit.abbr._M_str,unit.abbr._M_len);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, int64_t n, DisplayUnit unit) {
  char buf[sizeof("2562047788015216")];  // hours in max duration
  char* const ep = buf + sizeof(buf);
  char* bp = Format64(ep, 0, n);
  if (*bp != '0' || bp + 1 != ep) {
    out->append(bp, ep - bp);
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}